

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
viface::VIfaceImpl::listStats_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,VIfaceImpl *this)

{
  int iVar1;
  char *pcVar2;
  DIR *__dirp;
  ostream *poVar3;
  int *piVar4;
  runtime_error *prVar5;
  dirent *pdVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  string local_278 [32];
  _Base_ptr local_258;
  undefined1 local_250;
  allocator local_241;
  string local_240 [8];
  string entry;
  string local_218 [32];
  string local_1f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [8];
  string path;
  ostringstream local_1a8 [8];
  ostringstream what;
  dirent *ent;
  DIR *dir;
  VIfaceImpl *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *result;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator+((char *)local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "/sys/class/net/");
  std::operator+(local_1d8,(char *)local_1f8);
  std::__cxx11::string::~string(local_1f8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar2);
  if (__dirp == (DIR *)0x0) {
    std::operator<<((ostream *)local_1a8,"--- Unable to open statistics folder for interface ");
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)&this->name);
    poVar3 = std::operator<<(poVar3,":");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)local_1a8,"    ");
    poVar3 = std::operator<<(poVar3,(string *)local_1d8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)local_1a8,"    Error: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<((ostream *)local_1a8," (");
    piVar4 = __errno_location();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
    poVar3 = std::operator<<(poVar3,").");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_218);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,pdVar6->d_name,&local_241);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_240);
    if (*pcVar2 != '.') {
      pVar7 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(__return_storage_ptr__,(value_type *)local_240);
      local_258 = (_Base_ptr)pVar7.first._M_node;
      local_250 = pVar7.second;
    }
    std::__cxx11::string::~string(local_240);
  }
  iVar1 = closedir(__dirp);
  if (iVar1 != 0) {
    std::operator<<((ostream *)local_1a8,"--- Unable to close statistics folder for interface ");
    poVar3 = std::operator<<((ostream *)local_1a8,(string *)&this->name);
    poVar3 = std::operator<<(poVar3,":");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)local_1a8,"    ");
    poVar3 = std::operator<<(poVar3,(string *)local_1d8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<((ostream *)local_1a8,"    Error: ");
    piVar4 = __errno_location();
    pcVar2 = strerror(*piVar4);
    std::operator<<(poVar3,pcVar2);
    poVar3 = std::operator<<((ostream *)local_1a8," (");
    piVar4 = __errno_location();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
    poVar3 = std::operator<<(poVar3,").");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar5,local_278);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->stats_keys_cache,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> VIfaceImpl::listStats()
{
    set<string> result;

    DIR* dir;
    struct dirent* ent;
    ostringstream what;
    string path = "/sys/class/net/" + this->name + "/statistics/";

    // Open directory
    if ((dir = opendir(path.c_str())) == NULL) {
        what << "--- Unable to open statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // List files
    while ((ent = readdir(dir)) != NULL) {
        string entry(ent->d_name);

        // Ignore current, parent and hidden files
        if (entry[0] != '.') {
            result.insert(entry);
        }
    }

    // Close directory
    if (closedir(dir) != 0) {
        what << "--- Unable to close statistics folder for interface ";
        what << this->name << ":" << endl;
        what << "    " << path << endl;
        what << "    Error: " << strerror(errno);
        what << " (" << errno << ")." << endl;
        throw runtime_error(what.str());
    }

    // Update cache
    this->stats_keys_cache = result;

    return result;
}